

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[4],int,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [7],StackVar *args,char (*args_1) [4],int *args_2,
          char (*args_3) [3],Newline *args_4)

{
  size_t size;
  
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  size = strlen(*u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*u,size);
  anon_unknown_0::CWriter::Write((CWriter *)this,args);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," & ",3);
  anon_unknown_0::CWriter::Write((CWriter *)this,(long)(int)*args_1);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,");",2);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }